

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ItemSimilarityRecommender::ItemSimilarityRecommender
          (ItemSimilarityRecommender *this,ItemSimilarityRecommender *from)

{
  bool bVar1;
  string *psVar2;
  ulong uVar3;
  Arena *pAVar4;
  StringVector *this_00;
  Int64Vector *this_01;
  ItemSimilarityRecommender *from_local;
  ItemSimilarityRecommender *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__ItemSimilarityRecommender_006fc200;
  google::protobuf::RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>
  ::RepeatedPtrField(&this->itemitemsimilarities_,&from->itemitemsimilarities_);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->iteminputfeaturename_,psVar2);
  _internal_iteminputfeaturename_abi_cxx11_(from);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    psVar2 = _internal_iteminputfeaturename_abi_cxx11_(from);
    pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set(&this->iteminputfeaturename_,psVar2,pAVar4);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            (&this->numrecommendationsinputfeaturename_,psVar2);
  _internal_numrecommendationsinputfeaturename_abi_cxx11_(from);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    psVar2 = _internal_numrecommendationsinputfeaturename_abi_cxx11_(from);
    pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->numrecommendationsinputfeaturename_,psVar2,pAVar4);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            (&this->itemrestrictioninputfeaturename_,psVar2);
  _internal_itemrestrictioninputfeaturename_abi_cxx11_(from);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    psVar2 = _internal_itemrestrictioninputfeaturename_abi_cxx11_(from);
    pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->itemrestrictioninputfeaturename_,psVar2,pAVar4);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            (&this->itemexclusioninputfeaturename_,psVar2);
  _internal_itemexclusioninputfeaturename_abi_cxx11_(from);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    psVar2 = _internal_itemexclusioninputfeaturename_abi_cxx11_(from);
    pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->itemexclusioninputfeaturename_,psVar2,pAVar4);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            (&this->recommendeditemlistoutputfeaturename_,psVar2);
  _internal_recommendeditemlistoutputfeaturename_abi_cxx11_(from);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    psVar2 = _internal_recommendeditemlistoutputfeaturename_abi_cxx11_(from);
    pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->recommendeditemlistoutputfeaturename_,psVar2,pAVar4);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            (&this->recommendeditemscoreoutputfeaturename_,psVar2);
  _internal_recommendeditemscoreoutputfeaturename_abi_cxx11_(from);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    psVar2 = _internal_recommendeditemscoreoutputfeaturename_abi_cxx11_(from);
    pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->recommendeditemscoreoutputfeaturename_,psVar2,pAVar4);
  }
  bVar1 = _internal_has_itemstringids(from);
  if (bVar1) {
    this_00 = (StringVector *)operator_new(0x30);
    StringVector::StringVector(this_00,from->itemstringids_);
    this->itemstringids_ = this_00;
  }
  else {
    this->itemstringids_ = (StringVector *)0x0;
  }
  bVar1 = _internal_has_itemint64ids(from);
  if (bVar1) {
    this_01 = (Int64Vector *)operator_new(0x28);
    Int64Vector::Int64Vector(this_01,from->itemint64ids_);
    this->itemint64ids_ = this_01;
  }
  else {
    this->itemint64ids_ = (Int64Vector *)0x0;
  }
  return;
}

Assistant:

ItemSimilarityRecommender::ItemSimilarityRecommender(const ItemSimilarityRecommender& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      itemitemsimilarities_(from.itemitemsimilarities_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  iteminputfeaturename_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    iteminputfeaturename_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_iteminputfeaturename().empty()) {
    iteminputfeaturename_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_iteminputfeaturename(), 
      GetArenaForAllocation());
  }
  numrecommendationsinputfeaturename_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    numrecommendationsinputfeaturename_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_numrecommendationsinputfeaturename().empty()) {
    numrecommendationsinputfeaturename_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_numrecommendationsinputfeaturename(), 
      GetArenaForAllocation());
  }
  itemrestrictioninputfeaturename_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    itemrestrictioninputfeaturename_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_itemrestrictioninputfeaturename().empty()) {
    itemrestrictioninputfeaturename_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_itemrestrictioninputfeaturename(), 
      GetArenaForAllocation());
  }
  itemexclusioninputfeaturename_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    itemexclusioninputfeaturename_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_itemexclusioninputfeaturename().empty()) {
    itemexclusioninputfeaturename_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_itemexclusioninputfeaturename(), 
      GetArenaForAllocation());
  }
  recommendeditemlistoutputfeaturename_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    recommendeditemlistoutputfeaturename_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_recommendeditemlistoutputfeaturename().empty()) {
    recommendeditemlistoutputfeaturename_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_recommendeditemlistoutputfeaturename(), 
      GetArenaForAllocation());
  }
  recommendeditemscoreoutputfeaturename_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    recommendeditemscoreoutputfeaturename_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_recommendeditemscoreoutputfeaturename().empty()) {
    recommendeditemscoreoutputfeaturename_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_recommendeditemscoreoutputfeaturename(), 
      GetArenaForAllocation());
  }
  if (from._internal_has_itemstringids()) {
    itemstringids_ = new ::CoreML::Specification::StringVector(*from.itemstringids_);
  } else {
    itemstringids_ = nullptr;
  }
  if (from._internal_has_itemint64ids()) {
    itemint64ids_ = new ::CoreML::Specification::Int64Vector(*from.itemint64ids_);
  } else {
    itemint64ids_ = nullptr;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ItemSimilarityRecommender)
}